

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

ValueAwaiter __thiscall
async_simple::coro::Lazy<std::error_code>::coAwait(Lazy<std::error_code> *this,Executor *ex)

{
  _func_int **pp_Var1;
  _func_int *in_RDX;
  
  logicAssert(ex->_vptr_Executor != (_func_int **)0x0,
              "Lazy do not have a coroutine_handle Maybe the allocation failed or you\'re using a used Lazy"
             );
  ex->_vptr_Executor[3] = in_RDX;
  pp_Var1 = ex->_vptr_Executor;
  ex->_vptr_Executor = (_func_int **)0x0;
  (this->super_LazyBase<std::error_code,_false>)._coro.__handle_ = pp_Var1;
  return (AwaiterBase)(AwaiterBase)this;
}

Assistant:

auto coAwait(Executor* ex) {
        logicAssert(this->_coro.operator bool(),
                    "Lazy do not have a coroutine_handle "
                    "Maybe the allocation failed or you're using a used Lazy");

        // derived lazy inherits executor
        this->_coro.promise()._executor = ex;
        return typename Base::ValueAwaiter(std::exchange(this->_coro, nullptr));
    }